

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double llvm::detail::frexp(double __x,int *__exponent)

{
  fltCategory fVar1;
  type RHS;
  DoubleAPFloat *in_RSI;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  APFloat local_a8;
  APFloat local_88;
  undefined1 local_68 [8];
  APFloat Second;
  APFloat First;
  roundingMode RM_local;
  int *Exp_local;
  DoubleAPFloat *Arg_local;
  
  if (in_RSI->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Arg.Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1135,
                  "DoubleAPFloat llvm::detail::frexp(const DoubleAPFloat &, int &, APFloat::roundingMode)"
                 );
  }
  std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
            (&in_RSI->Floats,0);
  llvm::frexp(__x_00,(int *)&Second.U.IEEE.exponent);
  RHS = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                  (&in_RSI->Floats,1);
  APFloat::APFloat((APFloat *)local_68,RHS);
  fVar1 = DoubleAPFloat::getCategory(in_RSI);
  if (fVar1 == fcNormal) {
    APFloat::APFloat(&local_a8,(APFloat *)local_68);
    llvm::scalbn(__x_01,(int)&local_88);
    APFloat::operator=((APFloat *)local_68,&local_88);
    APFloat::~APFloat(&local_88);
    APFloat::~APFloat(&local_a8);
  }
  DoubleAPFloat::DoubleAPFloat
            ((DoubleAPFloat *)__exponent,(fltSemantics *)semPPCDoubleDouble,
             (APFloat *)((long)&Second.U + 0x10),(APFloat *)local_68);
  APFloat::~APFloat((APFloat *)local_68);
  APFloat::~APFloat((APFloat *)((long)&Second.U + 0x10));
  return extraout_XMM0_Qa;
}

Assistant:

DoubleAPFloat frexp(const DoubleAPFloat &Arg, int &Exp,
                    APFloat::roundingMode RM) {
  assert(Arg.Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat First = frexp(Arg.Floats[0], Exp, RM);
  APFloat Second = Arg.Floats[1];
  if (Arg.getCategory() == APFloat::fcNormal)
    Second = scalbn(Second, -Exp, RM);
  return DoubleAPFloat(semPPCDoubleDouble, std::move(First), std::move(Second));
}